

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncryptionHelper.cpp
# Opt level: O1

EStatusCode __thiscall
EncryptionHelper::Setup(EncryptionHelper *this,DecryptionHelper *inDecryptionSource)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  XCryptionCommon *pXVar2;
  bool bVar3;
  uint uVar4;
  longlong lVar5;
  ByteList *pBVar6;
  StringToXCryptionCommonMap *pSVar7;
  _Rb_tree_header *p_Var8;
  XCryptionCommon *this_00;
  XCryptionCommon *pXVar9;
  _Base_ptr p_Var10;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>
  local_58;
  
  bVar3 = DecryptionHelper::IsEncrypted(inDecryptionSource);
  if (bVar3) {
    bVar3 = DecryptionHelper::CanDecryptDocument(inDecryptionSource);
    if (bVar3) {
      this->mIsDocumentEncrypted = false;
      this->mSupportsEncryption = false;
      uVar4 = DecryptionHelper::GetLength(inDecryptionSource);
      this->mLength = uVar4;
      uVar4 = DecryptionHelper::GetV(inDecryptionSource);
      this->mV = uVar4;
      uVar4 = DecryptionHelper::GetRevision(inDecryptionSource);
      this->mRevision = uVar4;
      lVar5 = DecryptionHelper::GetP(inDecryptionSource);
      this->mP = lVar5;
      bVar3 = DecryptionHelper::GetEncryptMetaData(inDecryptionSource);
      this->mEncryptMetaData = bVar3;
      pBVar6 = DecryptionHelper::GetFileIDPart1_abi_cxx11_(inDecryptionSource);
      if (&this->mFileIDPart1 != pBVar6) {
        std::__cxx11::list<unsigned_char,std::allocator<unsigned_char>>::
        _M_assign_dispatch<std::_List_const_iterator<unsigned_char>>
                  ((list<unsigned_char,std::allocator<unsigned_char>> *)&this->mFileIDPart1,
                   (pBVar6->super__List_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   ._M_node.super__List_node_base._M_next,pBVar6);
      }
      pBVar6 = DecryptionHelper::GetO_abi_cxx11_(inDecryptionSource);
      if (&this->mO != pBVar6) {
        std::__cxx11::list<unsigned_char,std::allocator<unsigned_char>>::
        _M_assign_dispatch<std::_List_const_iterator<unsigned_char>>
                  ((list<unsigned_char,std::allocator<unsigned_char>> *)&this->mO,
                   (pBVar6->super__List_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   ._M_node.super__List_node_base._M_next,pBVar6);
      }
      pBVar6 = DecryptionHelper::GetU_abi_cxx11_(inDecryptionSource);
      if (&this->mU != pBVar6) {
        std::__cxx11::list<unsigned_char,std::allocator<unsigned_char>>::
        _M_assign_dispatch<std::_List_const_iterator<unsigned_char>>
                  ((list<unsigned_char,std::allocator<unsigned_char>> *)&this->mU,
                   (pBVar6->super__List_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   ._M_node.super__List_node_base._M_next,pBVar6);
      }
      this->mXcryptStreams = (XCryptionCommon *)0x0;
      this->mXcryptStrings = (XCryptionCommon *)0x0;
      this->mXcryptAuthentication = (XCryptionCommon *)0x0;
      pSVar7 = DecryptionHelper::GetXcrypts_abi_cxx11_(inDecryptionSource);
      p_Var10 = (pSVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      pSVar7 = DecryptionHelper::GetXcrypts_abi_cxx11_(inDecryptionSource);
      p_Var8 = &(pSVar7->_M_t)._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var10 != p_Var8) {
        paVar1 = &local_58.first.field_2;
        do {
          this_00 = (XCryptionCommon *)operator_new(0x58);
          XCryptionCommon::XCryptionCommon(this_00);
          bVar3 = XCryptionCommon::IsUsingAES(*(XCryptionCommon **)(p_Var10 + 2));
          XCryptionCommon::Setup(this_00,bVar3);
          pBVar6 = XCryptionCommon::GetInitialEncryptionKey_abi_cxx11_
                             (*(XCryptionCommon **)(p_Var10 + 2));
          XCryptionCommon::SetupInitialEncryptionKey(this_00,pBVar6);
          local_58.first._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_58,*(long *)(p_Var10 + 1),
                     (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
          local_58.second = this_00;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,XCryptionCommon*>,std::_Select1st<std::pair<std::__cxx11::string_const,XCryptionCommon*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,XCryptionCommon*>>>
          ::_M_insert_unique<std::pair<std::__cxx11::string_const,XCryptionCommon*>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,XCryptionCommon*>,std::_Select1st<std::pair<std::__cxx11::string_const,XCryptionCommon*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,XCryptionCommon*>>>
                      *)&this->mXcrypts,&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58.first._M_dataplus._M_p != paVar1) {
            operator_delete(local_58.first._M_dataplus._M_p,
                            local_58.first.field_2._M_allocated_capacity + 1);
          }
          pXVar2 = *(XCryptionCommon **)(p_Var10 + 2);
          pXVar9 = DecryptionHelper::GetStreamXcrypt(inDecryptionSource);
          if (pXVar2 == pXVar9) {
            this->mXcryptStreams = this_00;
          }
          pXVar2 = *(XCryptionCommon **)(p_Var10 + 2);
          pXVar9 = DecryptionHelper::GetStringXcrypt(inDecryptionSource);
          if (pXVar2 == pXVar9) {
            this->mXcryptStrings = this_00;
          }
          pXVar2 = *(XCryptionCommon **)(p_Var10 + 2);
          pXVar9 = DecryptionHelper::GetAuthenticationXcrypt(inDecryptionSource);
          if (pXVar2 == pXVar9) {
            this->mXcryptAuthentication = this_00;
          }
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
        } while ((_Rb_tree_header *)p_Var10 != p_Var8);
      }
      this->mIsDocumentEncrypted = true;
      goto LAB_001b457e;
    }
  }
  this->mIsDocumentEncrypted = false;
LAB_001b457e:
  this->mSupportsEncryption = true;
  return eSuccess;
}

Assistant:

EStatusCode EncryptionHelper::Setup(const DecryptionHelper& inDecryptionSource) 
{
	if (!inDecryptionSource.IsEncrypted() || !inDecryptionSource.CanDecryptDocument()) {
		SetupNoEncryption();
		return eSuccess;
	}

	mIsDocumentEncrypted = false;
	mSupportsEncryption = false;

	do {

		mLength = inDecryptionSource.GetLength();
		mV = inDecryptionSource.GetV();
		mRevision = inDecryptionSource.GetRevision();
		mP = inDecryptionSource.GetP();
		mEncryptMetaData = inDecryptionSource.GetEncryptMetaData();
		mFileIDPart1 = inDecryptionSource.GetFileIDPart1();
		mO = inDecryptionSource.GetO();
		mU = inDecryptionSource.GetU();

		// initialize xcryptors
		mXcryptStreams = NULL;
		// xcrypt to use for strings
		mXcryptStrings = NULL;
		// xcrypt to use for password authentication
		mXcryptAuthentication = NULL;
		StringToXCryptionCommonMap::const_iterator it = inDecryptionSource.GetXcrypts().begin();
		StringToXCryptionCommonMap::const_iterator itEnd = inDecryptionSource.GetXcrypts().end();
		for (; it != itEnd; ++it) {
			XCryptionCommon* xCryption = new XCryptionCommon();
			xCryption->Setup(it->second->IsUsingAES());
			xCryption->SetupInitialEncryptionKey(it->second->GetInitialEncryptionKey());
			mXcrypts.insert(StringToXCryptionCommonMap::value_type(it->first, xCryption));

			// see if it fits any of the global xcryptors
			if (it->second == inDecryptionSource.GetStreamXcrypt())
				mXcryptStreams = xCryption;
			if (it->second == inDecryptionSource.GetStringXcrypt())
				mXcryptStrings = xCryption;
			if (it->second == inDecryptionSource.GetAuthenticationXcrypt())
				mXcryptAuthentication = xCryption;
		}


		mIsDocumentEncrypted = true;
		mSupportsEncryption = true;
	} while (false);

	return eSuccess;
}